

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O1

void * __thiscall
DefaultSysAllocator::Alloc
          (DefaultSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  SysAllocator *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  int i;
  long lVar4;
  void *unaff_R15;
  void *pvVar5;
  
  lVar4 = 0;
  bVar3 = false;
  do {
    if ((this->failed_[lVar4] == false) &&
       (pSVar1 = this->allocs_[lVar4], pSVar1 != (SysAllocator *)0x0)) {
      iVar2 = (*pSVar1->_vptr_SysAllocator[2])(pSVar1,size,actual_size,alignment);
      pvVar5 = (void *)CONCAT44(extraout_var,iVar2);
      if ((void *)CONCAT44(extraout_var,iVar2) != (void *)0x0) break;
      this->failed_[lVar4] = true;
    }
    lVar4 = lVar4 + 1;
    bVar3 = lVar4 != 1;
    pvVar5 = unaff_R15;
  } while (lVar4 == 1);
  if (bVar3) {
    this->failed_[0] = false;
    this->failed_[1] = false;
    pvVar5 = (void *)0x0;
  }
  return pvVar5;
}

Assistant:

void* DefaultSysAllocator::Alloc(size_t size, size_t *actual_size,
                                 size_t alignment) {
  for (int i = 0; i < kMaxAllocators; i++) {
    if (!failed_[i] && allocs_[i] != nullptr) {
      void* result = allocs_[i]->Alloc(size, actual_size, alignment);
      if (result != nullptr) {
        return result;
      }
      failed_[i] = true;
    }
  }
  // After both failed, reset "failed_" to false so that a single failed
  // allocation won't make the allocator never work again.
  for (int i = 0; i < kMaxAllocators; i++) {
    failed_[i] = false;
  }
  return nullptr;
}